

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::ConvertHeader(EXRHeader *exr_header,HeaderInfo *info,string *warn,string *err)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type sVar4;
  void *pvVar5;
  char *__dest;
  char *__src;
  const_reference pvVar6;
  const_reference pvVar7;
  string *in_RCX;
  string *in_RDX;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *in_RSI;
  undefined4 *in_RDI;
  size_t i;
  size_t c_2;
  size_t c_1;
  size_t c;
  stringstream ss;
  bool valid;
  char *in_stack_fffffffffffffdc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  EXRHeader *in_stack_fffffffffffffde0;
  ulong local_208;
  ulong local_200;
  ulong local_1f8;
  ulong local_1f0;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [383];
  byte local_29;
  string *local_28;
  string *local_20;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *local_18;
  undefined4 *local_10;
  
  *in_RDI = *(undefined4 *)
             &in_RSI[4].
              super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
              _M_impl.super__Vector_impl_data._M_start;
  in_RDI[10] = *(undefined4 *)
                ((long)&in_RSI[3].
                        super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[0xb] = *(undefined4 *)
                 &in_RSI[3].
                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0xc] = *(undefined4 *)
                 ((long)&in_RSI[3].
                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  in_RDI[0xd] = *(undefined4 *)
                 ((long)&in_RSI[4].
                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[6] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  in_RDI[7] = *(undefined4 *)
               &in_RSI[3].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  in_RDI[8] = *(undefined4 *)
               ((long)&in_RSI[3].
                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[9] = *(undefined4 *)
               &in_RSI[3].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[2] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start;
  in_RDI[3] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
  in_RDI[4] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[5] = *(undefined4 *)
               ((long)&in_RSI[2].
                       super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[1] = *(undefined4 *)
               &in_RSI[2].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0x1f] = *(undefined4 *)
                  &in_RSI[5].
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  in_RDI[0xe] = *(undefined4 *)
                 &in_RSI[4].
                  super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
  in_RDI[0xf] = *(undefined4 *)
                 ((long)&in_RSI[4].
                         super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 4);
  in_RDI[0x10] = *(undefined4 *)
                  &in_RSI[4].
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
  in_RDI[0x11] = *(undefined4 *)
                  ((long)&in_RSI[4].
                          super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  in_RDI[0x12] = *(undefined4 *)
                  &in_RSI[5].
                   super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::c_str();
  EXRSetNameAttr(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_29 = 1;
    bVar1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    if (bVar1) {
      if (local_10[0xe] != 0) {
        if (local_28 != (string *)0x0) {
          std::__cxx11::string::operator+=
                    (local_28,"(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n");
        }
        local_29 = 0;
      }
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (bVar1) {
        if (local_10[0xe] == 0) {
          if (local_28 != (string *)0x0) {
            std::__cxx11::string::operator+=
                      (local_28,"(ConvertHeader) tiled bit must be on for `tiledimage` type.\n");
          }
          local_29 = 0;
        }
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        if (bVar1) {
          local_10[0x14] = 1;
          if (local_10[0xe] == 0) {
            if (local_28 != (string *)0x0) {
              std::__cxx11::string::operator+=
                        (local_28,"(ConvertHeader) tiled bit must be on for `deeptile` type.\n");
            }
            local_29 = 0;
          }
        }
        else {
          bVar1 = std::operator==(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
          if (bVar1) {
            local_10[0x14] = 1;
            if ((local_10[0xe] != 0) && (local_28 != (string *)0x0)) {
              std::__cxx11::string::operator+=
                        (local_28,"(ConvertHeader) tiled bit must be off for `deepscanline` type.\n"
                        );
            }
          }
          else if (local_20 != (string *)0x0) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            poVar3 = std::operator<<(local_1a8,"(ConvertHeader) Unsupported or unknown info.type: ")
            ;
            poVar3 = std::operator<<(poVar3,(string *)(local_18 + 7));
            std::operator<<(poVar3,"\n");
            std::__cxx11::stringstream::str();
            std::__cxx11::string::operator+=(local_20,local_1e8);
            std::__cxx11::string::~string(local_1e8);
            std::__cxx11::stringstream::~stringstream(local_1b8);
          }
        }
      }
    }
    if ((local_29 & 1) == 0) {
      return false;
    }
  }
  sVar4 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::size(local_18)
  ;
  local_10[0x1e] = (int)sVar4;
  pvVar5 = malloc((long)(int)local_10[0x1e] * 0x110);
  *(void **)(local_10 + 0x1a) = pvVar5;
  for (local_1f0 = 0; local_1f0 < (ulong)(long)(int)local_10[0x1e]; local_1f0 = local_1f0 + 1) {
    __dest = (char *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110);
    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
              (local_18,local_1f0);
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(__dest,__src,0xff);
    *(undefined1 *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110 + 0xff) = 0;
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_1f0);
    *(int *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110 + 0x100) = pvVar6->pixel_type;
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_1f0);
    *(uchar *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110 + 0x10c) = pvVar6->p_linear;
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_1f0);
    *(int *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110 + 0x104) = pvVar6->x_sampling;
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_1f0);
    *(int *)(*(long *)(local_10 + 0x1a) + local_1f0 * 0x110 + 0x108) = pvVar6->y_sampling;
  }
  pvVar5 = malloc((long)(int)local_10[0x1e] << 2);
  *(void **)(local_10 + 0x1c) = pvVar5;
  for (local_1f8 = 0; local_1f8 < (ulong)(long)(int)local_10[0x1e]; local_1f8 = local_1f8 + 1) {
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_1f8);
    *(int *)(*(long *)(local_10 + 0x1c) + local_1f8 * 4) = pvVar6->pixel_type;
  }
  pvVar5 = malloc((long)(int)local_10[0x1e] << 2);
  *(void **)(local_10 + 0x20) = pvVar5;
  for (local_200 = 0; local_200 < (ulong)(long)(int)local_10[0x1e]; local_200 = local_200 + 1) {
    pvVar6 = std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::operator[]
                       (local_18,local_200);
    *(int *)(*(long *)(local_10 + 0x20) + local_200 * 4) = pvVar6->pixel_type;
  }
  sVar4 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::size
                    ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)(local_18 + 1));
  local_10[0x17] = (int)sVar4;
  if ((int)local_10[0x17] < 1) {
    *(undefined8 *)(local_10 + 0x18) = 0;
  }
  else {
    if (0x80 < (int)local_10[0x17]) {
      local_10[0x17] = 0x80;
    }
    pvVar5 = malloc((long)(int)local_10[0x17] * 0x210);
    *(void **)(local_10 + 0x18) = pvVar5;
    for (local_208 = 0; local_208 < (ulong)(long)(int)local_10[0x17]; local_208 = local_208 + 1) {
      pvVar5 = (void *)(*(long *)(local_10 + 0x18) + local_208 * 0x210);
      pvVar7 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)(local_18 + 1),
                          local_208);
      memcpy(pvVar5,pvVar7,0x100);
      pvVar5 = (void *)(*(long *)(local_10 + 0x18) + local_208 * 0x210 + 0x100);
      pvVar7 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)(local_18 + 1),
                          local_208);
      memcpy(pvVar5,pvVar7->type,0x100);
      pvVar7 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)(local_18 + 1),
                          local_208);
      *(int *)(*(long *)(local_10 + 0x18) + local_208 * 0x210 + 0x208) = pvVar7->size;
      pvVar7 = std::vector<TEXRAttribute,_std::allocator<TEXRAttribute>_>::operator[]
                         ((vector<TEXRAttribute,_std::allocator<TEXRAttribute>_> *)(local_18 + 1),
                          local_208);
      *(uchar **)(*(long *)(local_10 + 0x18) + local_208 * 0x210 + 0x200) = pvVar7->value;
    }
  }
  local_10[0x16] =
       *(undefined4 *)
        ((long)&local_18[5].
                super__Vector_base<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>.
                _M_impl.super__Vector_impl_data._M_start + 4);
  return true;
}

Assistant:

static bool ConvertHeader(EXRHeader *exr_header, const HeaderInfo &info, std::string *warn, std::string *err) {
  exr_header->pixel_aspect_ratio = info.pixel_aspect_ratio;
  exr_header->screen_window_center[0] = info.screen_window_center[0];
  exr_header->screen_window_center[1] = info.screen_window_center[1];
  exr_header->screen_window_width = info.screen_window_width;
  exr_header->chunk_count = info.chunk_count;
  exr_header->display_window.min_x = info.display_window.min_x;
  exr_header->display_window.min_y = info.display_window.min_y;
  exr_header->display_window.max_x = info.display_window.max_x;
  exr_header->display_window.max_y = info.display_window.max_y;
  exr_header->data_window.min_x = info.data_window.min_x;
  exr_header->data_window.min_y = info.data_window.min_y;
  exr_header->data_window.max_x = info.data_window.max_x;
  exr_header->data_window.max_y = info.data_window.max_y;
  exr_header->line_order = info.line_order;
  exr_header->compression_type = info.compression_type;
  exr_header->tiled = info.tiled;
  exr_header->tile_size_x = info.tile_size_x;
  exr_header->tile_size_y = info.tile_size_y;
  exr_header->tile_level_mode = info.tile_level_mode;
  exr_header->tile_rounding_mode = info.tile_rounding_mode;

  EXRSetNameAttr(exr_header, info.name.c_str());


  if (!info.type.empty()) {
    bool valid = true;
    if (info.type == "scanlineimage") {
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `scanlineimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "tiledimage") {
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `tiledimage` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deeptile") {
      exr_header->non_image = 1;
      if (!exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be on for `deeptile` type.\n";
        }
        valid = false;
      }
    } else if (info.type == "deepscanline") {
      exr_header->non_image = 1;
      if (exr_header->tiled) {
        if (err) {
          (*err) += "(ConvertHeader) tiled bit must be off for `deepscanline` type.\n";
        }
        //valid = false;
      }
    } else {
      if (warn) {
        std::stringstream ss;
        ss << "(ConvertHeader) Unsupported or unknown info.type: " << info.type << "\n";
        (*warn) += ss.str();
      }
    }

    if (!valid) {
      return false;
    }
  }

  exr_header->num_channels = static_cast<int>(info.channels.size());

  exr_header->channels = static_cast<EXRChannelInfo *>(malloc(
      sizeof(EXRChannelInfo) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
#ifdef _MSC_VER
    strncpy_s(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#else
    strncpy(exr_header->channels[c].name, info.channels[c].name.c_str(), 255);
#endif
    // manually add '\0' for safety.
    exr_header->channels[c].name[255] = '\0';

    exr_header->channels[c].pixel_type = info.channels[c].pixel_type;
    exr_header->channels[c].p_linear = info.channels[c].p_linear;
    exr_header->channels[c].x_sampling = info.channels[c].x_sampling;
    exr_header->channels[c].y_sampling = info.channels[c].y_sampling;
  }

  exr_header->pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->pixel_types[c] = info.channels[c].pixel_type;
  }

  // Initially fill with values of `pixel_types`
  exr_header->requested_pixel_types = static_cast<int *>(
      malloc(sizeof(int) * static_cast<size_t>(exr_header->num_channels)));
  for (size_t c = 0; c < static_cast<size_t>(exr_header->num_channels); c++) {
    exr_header->requested_pixel_types[c] = info.channels[c].pixel_type;
  }

  exr_header->num_custom_attributes = static_cast<int>(info.attributes.size());

  if (exr_header->num_custom_attributes > 0) {
    // TODO(syoyo): Report warning when # of attributes exceeds
    // `TINYEXR_MAX_CUSTOM_ATTRIBUTES`
    if (exr_header->num_custom_attributes > TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
      exr_header->num_custom_attributes = TINYEXR_MAX_CUSTOM_ATTRIBUTES;
    }

    exr_header->custom_attributes = static_cast<EXRAttribute *>(malloc(
        sizeof(EXRAttribute) * size_t(exr_header->num_custom_attributes)));

    for (size_t i = 0; i < size_t(exr_header->num_custom_attributes); i++) {
      memcpy(exr_header->custom_attributes[i].name, info.attributes[i].name,
             256);
      memcpy(exr_header->custom_attributes[i].type, info.attributes[i].type,
             256);
      exr_header->custom_attributes[i].size = info.attributes[i].size;
      // Just copy pointer
      exr_header->custom_attributes[i].value = info.attributes[i].value;
    }

  } else {
    exr_header->custom_attributes = NULL;
  }

  exr_header->header_len = info.header_len;

  return true;
}